

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ExtractSubrangeInternal(void *param_1,int param_2,int param_3,long param_4)

{
  Arena *pAVar1;
  string *psVar2;
  Type *pTVar3;
  int i_1;
  Type *new_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *element;
  int i;
  Arena *in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffec0;
  undefined4 local_104;
  undefined4 local_f0;
  int in_stack_ffffffffffffff6c;
  RepeatedPtrFieldBase *in_stack_ffffffffffffff70;
  
  if (0 < param_3) {
    if (param_4 != 0) {
      pAVar1 = GetArenaNoVirtual((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)0x403d8b);
      if (pAVar1 == (Arena *)0x0) {
        for (local_104 = 0; local_104 < param_3; local_104 = local_104 + 1) {
          pTVar3 = internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
          *(Type **)(param_4 + (long)local_104 * 8) = pTVar3;
        }
      }
      else {
        for (local_f0 = 0; local_f0 < param_3; local_f0 = local_f0 + 1) {
          internal::RepeatedPtrFieldBase::
          Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
          psVar2 = internal::StringTypeHandler::NewFromPrototype
                             (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          internal::StringTypeHandler::Merge
                    (in_stack_fffffffffffffec0,(string *)in_stack_fffffffffffffeb8);
          *(string **)(param_4 + (long)local_f0 * 8) = psVar2;
        }
      }
    }
    internal::RepeatedPtrFieldBase::CloseGap((RepeatedPtrFieldBase *)param_1,param_2,param_3);
  }
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::ExtractSubrangeInternal(
    int start, int num, Element** elements, std::true_type) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, size());

  if (num > 0) {
    // Save the values of the removed elements if requested.
    if (elements != NULL) {
      if (GetArenaNoVirtual() != NULL) {
        // If we're on an arena, we perform a copy for each element so that the
        // returned elements are heap-allocated.
        for (int i = 0; i < num; ++i) {
          Element* element =
              RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
          typename TypeHandler::Type* new_value =
              TypeHandler::NewFromPrototype(element, NULL);
          TypeHandler::Merge(*element, new_value);
          elements[i] = new_value;
        }
      } else {
        for (int i = 0; i < num; ++i) {
          elements[i] = RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
        }
      }
    }
    CloseGap(start, num);
  }
}